

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go_destruct.cc
# Opt level: O0

void __thiscall re2c::If::~If(If *this)

{
  Binary *this_00;
  Linear *this_01;
  If *this_local;
  
  if (this->type == BINARY) {
    this_00 = (this->info).binary;
    if (this_00 != (Binary *)0x0) {
      Binary::~Binary(this_00);
      operator_delete(this_00,0x18);
    }
  }
  else if ((this->type == LINEAR) && (this_01 = (this->info).linear, this_01 != (Linear *)0x0)) {
    Linear::~Linear(this_01);
    operator_delete(this_01,0x18);
  }
  return;
}

Assistant:

If::~If ()
{
	switch (type)
	{
		case BINARY:
			delete info.binary;
			break;
		case LINEAR:
			delete info.linear;
			break;
	}
}